

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

TableSize * __thiscall MixedArena::alloc<wasm::TableSize>(MixedArena *this)

{
  TableSize *pTVar1;
  
  pTVar1 = (TableSize *)allocSpace(this,0x20,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)47>).super_Expression._id = TableSizeId;
  (pTVar1->table).super_IString.str._M_len = 0;
  (pTVar1->table).super_IString.str._M_str = (char *)0x0;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)47>).super_Expression.type.id = 2;
  return pTVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }